

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile_sort_tree.hpp
# Opt level: O2

dtime_t __thiscall
duckdb::Interpolator<false>::
Operation<duckdb::dtime_t,duckdb::dtime_t,duckdb::QuantileDirect<duckdb::dtime_t>>
          (Interpolator<false> *this,dtime_t *v_t,Vector *result,
          QuantileDirect<duckdb::dtime_t> *accessor)

{
  bool bVar1;
  QuantileCompare<duckdb::QuantileDirect<duckdb::dtime_t>_> __comp;
  QuantileCompare<duckdb::QuantileDirect<duckdb::dtime_t>_> __comp_00;
  QuantileCompare<duckdb::QuantileDirect<duckdb::dtime_t>_> __comp_01;
  dtime_t dVar2;
  dtime_t hi;
  dtime_t lo;
  undefined7 uStack_67;
  undefined7 uStack_4f;
  undefined7 uStack_37;
  dtime_t local_30;
  dtime_t local_28;
  
  bVar1 = this->desc;
  if (this->CRN == this->FRN) {
    __comp._17_7_ = uStack_37;
    __comp.desc = bVar1;
    __comp.accessor_r = accessor;
    __comp.accessor_l = accessor;
    ::std::
    nth_element<duckdb::dtime_t*,duckdb::QuantileCompare<duckdb::QuantileDirect<duckdb::dtime_t>>>
              (v_t + this->begin,v_t + this->CRN,v_t + this->end,__comp);
    dVar2 = Cast::Operation<duckdb::dtime_t,duckdb::dtime_t>(v_t[this->FRN].micros);
    return (dtime_t)dVar2.micros;
  }
  __comp_00._17_7_ = uStack_4f;
  __comp_00.desc = bVar1;
  __comp_00.accessor_r = accessor;
  __comp_00.accessor_l = accessor;
  ::std::
  nth_element<duckdb::dtime_t*,duckdb::QuantileCompare<duckdb::QuantileDirect<duckdb::dtime_t>>>
            (v_t + this->begin,v_t + this->FRN,v_t + this->end,__comp_00);
  __comp_01._17_7_ = uStack_67;
  __comp_01.desc = bVar1;
  __comp_01.accessor_r = accessor;
  __comp_01.accessor_l = accessor;
  ::std::
  nth_element<duckdb::dtime_t*,duckdb::QuantileCompare<duckdb::QuantileDirect<duckdb::dtime_t>>>
            (v_t + this->FRN,v_t + this->CRN,v_t + this->end,__comp_01);
  local_28 = Cast::Operation<duckdb::dtime_t,duckdb::dtime_t>(v_t[this->FRN].micros);
  local_30 = Cast::Operation<duckdb::dtime_t,duckdb::dtime_t>(v_t[this->CRN].micros);
  dVar2 = CastInterpolation::Interpolate<duckdb::dtime_t>
                    (&local_28,
                     this->RN -
                     (((double)CONCAT44(0x45300000,(int)(this->FRN >> 0x20)) -
                      1.9342813113834067e+25) +
                     ((double)CONCAT44(0x43300000,(int)this->FRN) - 4503599627370496.0)),&local_30);
  return (dtime_t)dVar2.micros;
}

Assistant:

TARGET_TYPE Operation(INPUT_TYPE *v_t, Vector &result, const ACCESSOR &accessor = ACCESSOR()) const {
		using ACCESS_TYPE = typename ACCESSOR::RESULT_TYPE;
		QuantileCompare<ACCESSOR> comp(accessor, desc);
		if (CRN == FRN) {
			std::nth_element(v_t + begin, v_t + FRN, v_t + end, comp);
			return CastInterpolation::Cast<ACCESS_TYPE, TARGET_TYPE>(accessor(v_t[FRN]), result);
		} else {
			std::nth_element(v_t + begin, v_t + FRN, v_t + end, comp);
			std::nth_element(v_t + FRN, v_t + CRN, v_t + end, comp);
			auto lo = CastInterpolation::Cast<ACCESS_TYPE, TARGET_TYPE>(accessor(v_t[FRN]), result);
			auto hi = CastInterpolation::Cast<ACCESS_TYPE, TARGET_TYPE>(accessor(v_t[CRN]), result);
			return CastInterpolation::Interpolate<TARGET_TYPE>(lo, RN - FRN, hi);
		}
	}